

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::removeInternalVertex
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint edge)

{
  AnchorPoint in_EDX;
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar1;
  bool in_stack_0000001b;
  AnchorPoint in_stack_0000001c;
  QGraphicsLayoutItem *in_stack_00000020;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> v;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> pair;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *in_stack_ffffffffffffff68;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *this_00;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *key;
  undefined1 in_stack_ffffffffffffff80 [16];
  char local_68 [32];
  AnchorVertex *local_48;
  int local_40;
  AnchorPoint local_34;
  QGraphicsLayoutItem *local_30;
  AnchorVertex *local_28;
  undefined1 *puStack_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)local_18;
  local_34 = in_EDX;
  std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>::
  pair<QGraphicsLayoutItem_*&,_Qt::AnchorPoint_&,_true>(this_00,&local_30,&local_34);
  local_28 = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  key = in_stack_ffffffffffffff80._0_8_;
  pVar1 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(in_stack_ffffffffffffff80._8_8_,key);
  local_48 = pVar1.first;
  local_40 = pVar1.second;
  puStack_20 = (undefined1 *)CONCAT44(puStack_20._4_4_,local_40);
  local_28 = local_48;
  if (local_48 == (AnchorVertex *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)key,(char *)this_00,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff68);
    QMessageLogger::warning(local_68,"This item with this edge is not in the graph");
  }
  else {
    puStack_20 = (undefined1 *)CONCAT44(puStack_20._4_4_,local_40 + -1);
    if (local_40 + -1 == 0) {
      QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
      ::remove(in_RDI + 0x2d,local_18);
      if (local_28 != (AnchorVertex *)0x0) {
        (*local_28->_vptr_AnchorVertex[1])();
      }
    }
    else {
      QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
      ::insert(in_RDI,in_stack_ffffffffffffff68,
               (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *)0x93e103);
      if (((int)puStack_20 == 2) &&
         ((local_34 == AnchorHorizontalCenter || (local_34 == AnchorVerticalCenter)))) {
        removeCenterAnchors(this,in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeInternalVertex(QGraphicsLayoutItem *item,
                                                        Qt::AnchorPoint edge)
{
    std::pair<QGraphicsLayoutItem *, Qt::AnchorPoint> pair(item, edge);
    std::pair<AnchorVertex *, int> v = m_vertexList.value(pair);

    if (!v.first) {
        qWarning("This item with this edge is not in the graph");
        return;
    }

    v.second--;
    if (v.second == 0) {
        // Remove reference and delete vertex
        m_vertexList.remove(pair);
        delete v.first;
    } else {
        // Update reference count
        m_vertexList.insert(pair, v);

        if ((v.second == 2) &&
            ((edge == Qt::AnchorHorizontalCenter) ||
             (edge == Qt::AnchorVerticalCenter))) {
            removeCenterAnchors(item, edge, true);
        }
    }
}